

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O3

shared_ptr<gui::DialogBox> __thiscall EditorInterface::createOverwriteDialog(EditorInterface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar1;
  Theme *pTVar2;
  _func_int **pp_Var3;
  DialogBox *pDVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  size_type sVar7;
  _Link_type __z;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  shared_ptr<gui::Button> *in_RSI;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *this_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar9;
  shared_ptr<gui::DialogBox> sVar10;
  shared_ptr<gui::Button> overwriteCancelButton;
  shared_ptr<gui::Label> overwriteLabel;
  shared_ptr<gui::Button> overwriteSubmitButton;
  shared_ptr<gui::Label> overwriteTitle;
  String local_130;
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  shared_ptr<gui::Button> local_c0;
  shared_ptr<gui::Button> local_b0;
  _Head_base<0UL,_gui::Theme_*,_false> local_a0;
  _Head_base<0UL,_gui::Gui_*,_false> local_98;
  shared_ptr<gui::Label> local_90;
  undefined1 local_80 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [24];
  _Base_ptr local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pTVar2 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_d8);
  sf::String::String(&local_130,"overwriteDialog",(locale *)local_d8);
  ::gui::DialogBox::create((DialogBox *)&stack0xffffffffffffffc0,pTVar2,&local_130);
  debugWidgetCreation<gui::DialogBox>(this,(shared_ptr<gui::DialogBox> *)in_RSI);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  paVar1 = &local_130.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_d8);
  local_130.m_string._M_dataplus._M_p = (pointer)0x42c8000043e10000;
  local_d8._16_8_ = this;
  ::gui::DialogBox::setSize
            ((DialogBox *)(this->super_Drawable)._vptr_Drawable,(Vector2f *)&local_130);
  pp_Var3 = (this->super_Drawable)._vptr_Drawable;
  (**(code **)(*pp_Var3 + 0x18))(pp_Var3,0);
  pp_Var3 = (this->super_Drawable)._vptr_Drawable;
  pTVar2 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_100);
  sf::String::String(&local_130,"overwriteTitle",(locale *)local_100);
  ::gui::Label::create((Label *)(local_60 + 0x10),pTVar2,&local_130);
  debugWidgetCreation<gui::Label>((EditorInterface *)local_d8,(shared_ptr<gui::Label> *)in_RSI);
  if (local_48 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_100);
  uVar6 = local_d8._0_8_;
  std::locale::locale((locale *)local_100);
  sf::String::String(&local_130,"Overwrite File?",(locale *)local_100);
  ::gui::Label::setLabel((Label *)uVar6,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_100);
  pDVar4 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  local_90.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_90.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  if ((Gui *)local_d8._8_8_ != (Gui *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((EditorInterface *)(local_d8._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_d8._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((EditorInterface *)(local_d8._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_d8._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
    }
  }
  ::gui::DialogBox::setTitle(pDVar4,&local_90);
  if ((Editor *)
      local_90.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  pTVar2 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_e8);
  sf::String::String(&local_130,"overwriteLabel",(locale *)local_e8);
  ::gui::Label::create((Label *)local_60,pTVar2,&local_130);
  debugWidgetCreation<gui::Label>((EditorInterface *)local_100,(shared_ptr<gui::Label> *)in_RSI);
  if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_e8);
  uVar6 = local_100._0_8_;
  std::locale::locale((locale *)local_e8);
  sf::String::String(&local_130,"The file already exists, do you want to replace it?",
                     (locale *)local_e8);
  ::gui::Label::setLabel((Label *)uVar6,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_e8);
  ::gui::Widget::setPosition((Widget *)local_100._0_8_,10.0,30.0);
  pp_Var5 = (this->super_Drawable)._vptr_Drawable;
  local_a0._M_head_impl = (Theme *)local_100._0_8_;
  local_98._M_head_impl = (Gui *)local_100._8_8_;
  if ((Editor *)local_100._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((_Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  *)&((EditorInterface *)(local_100._8_8_ + 8))->super_Drawable)->_M_impl).
               super__Vector_impl_data._M_start =
           *(int *)&(((_Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                       *)&((EditorInterface *)(local_100._8_8_ + 8))->super_Drawable)->_M_impl).
                    super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((_Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  *)&((EditorInterface *)(local_100._8_8_ + 8))->super_Drawable)->_M_impl).
               super__Vector_impl_data._M_start =
           *(int *)&(((_Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                       *)&((EditorInterface *)(local_100._8_8_ + 8))->super_Drawable)->_M_impl).
                    super__Vector_impl_data._M_start + 1;
    }
  }
  (**(code **)(*pp_Var5 + 0x10))(pp_Var5,&local_a0);
  if (local_98._M_head_impl != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_head_impl);
  }
  pTVar2 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)local_110);
  sf::String::String(&local_130,"overwriteSubmitButton",(locale *)local_110);
  ::gui::Button::create((Button *)(local_80 + 0x10),pTVar2,&local_130);
  debugWidgetCreation<gui::Button>((EditorInterface *)local_e8,in_RSI);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_110);
  uVar6 = local_e8._0_8_;
  std::locale::locale((locale *)local_110);
  sf::String::String(&local_130,"Overwrite",(locale *)local_110);
  ::gui::Button::setLabel((Button *)uVar6,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)local_110);
  pDVar4 = (DialogBox *)(this->super_Drawable)._vptr_Drawable;
  local_b0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_e8._0_8_;
  local_b0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  if ((Editor *)local_e8._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((EditorInterface *)(local_e8._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_e8._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((EditorInterface *)(local_e8._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_e8._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
    }
  }
  ::gui::DialogBox::setSubmitButton(pDVar4,0,&local_b0);
  if ((_Base_ptr)
      local_b0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pTVar2 = (Theme *)in_RSI[4].super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  std::locale::locale((locale *)(local_100 + 0x10));
  sf::String::String(&local_130,"overwriteCancelButton",(locale *)(local_100 + 0x10));
  ::gui::Button::create((Button *)local_80,pTVar2,&local_130);
  debugWidgetCreation<gui::Button>((EditorInterface *)local_110,in_RSI);
  if ((element_type *)local_80._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)(local_100 + 0x10));
  uVar6 = local_110._0_8_;
  std::locale::locale((locale *)(local_100 + 0x10));
  sf::String::String(&local_130,"Cancel",(locale *)(local_100 + 0x10));
  ::gui::Button::setLabel((Button *)uVar6,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_130.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_130.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)(local_100 + 0x10));
  this_00 = (map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             *)(local_110._0_8_ + 600);
  sVar7 = std::
          map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::count(this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  while (sVar7 != 0) {
    ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
    sVar7 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(this_00,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
  }
  __z = (_Link_type)operator_new(0x50);
  *(int *)(__z->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
  *(shared_ptr<gui::Button> **)((__z->_M_storage)._M_storage + 8) = in_RSI;
  *(_func_int ***)((__z->_M_storage)._M_storage + 0x10) = pp_Var3;
  *(code **)((__z->_M_storage)._M_storage + 0x20) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:603:44)>
       ::_M_invoke;
  *(code **)((__z->_M_storage)._M_storage + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:603:44)>
       ::_M_manager;
  (__z->_M_storage)._M_storage[0x28] = '\x01';
  (__z->_M_storage)._M_storage[0x29] = '\0';
  (__z->_M_storage)._M_storage[0x2a] = '\0';
  (__z->_M_storage)._M_storage[0x2b] = '\0';
  pVar9 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
          ::_M_get_insert_unique_pos
                    ((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_00,(key_type_conflict1 *)&__z->_M_storage);
  uVar6 = local_d8._16_8_;
  if (pVar9.second == (_Base_ptr)0x0) {
    ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
              ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
               ((__z->_M_storage)._M_storage + 8));
    operator_delete(__z);
  }
  else {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::_M_insert_node((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
                      *)this_00,pVar9.first,pVar9.second,__z);
  }
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  pDVar4 = *(DialogBox **)uVar6;
  local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_110._0_8_;
  local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_;
  if ((Editor *)local_110._8_8_ != (Editor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((EditorInterface *)(local_110._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_110._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((EditorInterface *)(local_110._8_8_ + 8))->super_Drawable)._vptr_Drawable =
           *(int *)&(((EditorInterface *)(local_110._8_8_ + 8))->super_Drawable)._vptr_Drawable + 1;
    }
  }
  ::gui::DialogBox::setCancelButton(pDVar4,1,&local_c0);
  _Var8._M_pi = extraout_RDX;
  if ((Theme *)local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi != (Theme *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var8._M_pi = extraout_RDX_00;
  }
  if ((Editor *)local_110._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    _Var8._M_pi = extraout_RDX_01;
  }
  if ((Editor *)local_e8._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    _Var8._M_pi = extraout_RDX_02;
  }
  if ((Editor *)local_100._8_8_ != (Editor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    _Var8._M_pi = extraout_RDX_03;
  }
  if ((_Head_base<0UL,_gui::Gui_*,_false>)local_d8._8_8_ != (_Head_base<0UL,_gui::Gui_*,_false>)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    _Var8._M_pi = extraout_RDX_04;
  }
  sVar10.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar10.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar6;
  return (shared_ptr<gui::DialogBox>)
         sVar10.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gui::DialogBox> EditorInterface::createOverwriteDialog() const {
    auto overwriteDialog = debugWidgetCreation(gui::DialogBox::create(*theme_, "overwriteDialog"));
    overwriteDialog->setSize({450.0f, 100.0f});
    overwriteDialog->setVisible(false);
    auto overwriteDialogPtr = overwriteDialog.get();

    auto overwriteTitle = debugWidgetCreation(gui::Label::create(*theme_, "overwriteTitle"));
    overwriteTitle->setLabel("Overwrite File?");
    overwriteDialog->setTitle(overwriteTitle);

    auto overwriteLabel = debugWidgetCreation(gui::Label::create(*theme_, "overwriteLabel"));
    overwriteLabel->setLabel("The file already exists, do you want to replace it?");
    overwriteLabel->setPosition(10.0f, 30.0f);
    overwriteDialog->addChild(overwriteLabel);

    auto overwriteSubmitButton = debugWidgetCreation(gui::Button::create(*theme_, "overwriteSubmitButton"));
    overwriteSubmitButton->setLabel("Overwrite");
    overwriteDialog->setSubmitButton(0, overwriteSubmitButton);

    auto overwriteCancelButton = debugWidgetCreation(gui::Button::create(*theme_, "overwriteCancelButton"));
    overwriteCancelButton->setLabel("Cancel");
    overwriteCancelButton->onClick.connect([this,overwriteDialogPtr]() {
        overwriteDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
    });
    overwriteDialog->setCancelButton(1, overwriteCancelButton);

    return overwriteDialog;
}